

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_mesh_materials.cxx
# Opt level: O3

bool __thiscall level_mesh::search_colinear_path(level_mesh *this,uint32_t v0,uint32_t v1)

{
  long lVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  pointer p_Var5;
  pointer pbVar6;
  iterator __position;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar9;
  ulong uVar10;
  undefined1 *puVar11;
  undefined1 *puVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  uint local_5c;
  undefined1 local_58 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_48;
  ulong local_40;
  uint local_34;
  
  local_40 = (ulong)v0;
  p_Var5 = (this->super_xr_mesh_builder).super_xr_mesh.m_points.
           super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  fVar17 = p_Var5[local_40].field_0.field_0.x - p_Var5[v1].field_0.field_0.x;
  fVar21 = p_Var5[local_40].field_0.field_0.y - p_Var5[v1].field_0.field_0.y;
  fVar18 = p_Var5[local_40].field_0.field_0.z - p_Var5[v1].field_0.field_0.z;
  local_48 = &this->m_path;
  local_34 = v1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_fill_assign(local_48,1,&local_34);
  fVar19 = fVar18 * fVar18 + fVar17 * fVar17 + fVar21 * fVar21;
  uVar16 = (ulong)local_34;
  do {
    uVar13 = (this->super_xr_mesh_builder).m_vertex_faces.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar16];
    if (uVar13 == 0xffffffff) {
      return false;
    }
    p_Var5 = (this->super_xr_mesh_builder).super_xr_mesh.m_points.
             super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    fVar2 = p_Var5[uVar16].field_0.field_0.x;
    fVar3 = p_Var5[uVar16].field_0.field_0.y;
    fVar4 = p_Var5[uVar16].field_0.field_0.z;
    while( true ) {
      uVar9 = (ulong)uVar13;
      pbVar6 = (this->super_xr_mesh_builder).m_faces.
               super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar12 = (undefined1 *)((long)&pbVar6[uVar9].field_0 + 0x14);
      puVar11 = (undefined1 *)((long)&pbVar6[uVar9].field_0 + 0x10);
      uVar14 = 5;
      uVar10 = 4;
      lVar15 = 0xc;
      do {
        if (lVar15 == 9) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/./xr_mesh_builder.h"
                        ,0x9a,
                        "uint_fast32_t xray_re::xr_mesh_builder::b_face::local_vert_idx(uint_fast32_t) const"
                       );
        }
        lVar1 = lVar15 * 4;
        puVar12 = puVar12 + -4;
        uVar14 = uVar14 - 1;
        puVar11 = puVar11 + -4;
        uVar10 = uVar10 - 1;
        lVar15 = lVar15 + -1;
      } while (uVar16 != *(uint *)((long)pbVar6 + lVar1 + uVar9 * 0x40 + -0x28));
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar10;
      uVar10 = (ulong)*(uint *)(puVar11 +
                               (SUB168(auVar7 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 &
                               0xfffffffffffffffcU) * -3);
      p_Var5 = (this->super_xr_mesh_builder).super_xr_mesh.m_points.
               super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      fVar22 = p_Var5[uVar10].field_0.field_0.x - fVar2;
      fVar24 = p_Var5[uVar10].field_0.field_0.y - fVar3;
      fVar23 = p_Var5[uVar10].field_0.field_0.z - fVar4;
      fVar20 = (fVar23 * fVar23 + fVar22 * fVar22 + fVar24 * fVar24) * fVar19;
      if (fVar20 < 0.0) {
        local_58 = ZEXT416((uint)fVar23);
        fVar20 = sqrtf(fVar20);
        fVar23 = local_58._0_4_;
      }
      else {
        fVar20 = SQRT(fVar20);
      }
      fVar20 = (fVar23 * fVar18 + fVar22 * fVar17 + fVar24 * fVar21) / fVar20;
      if ((float)(~-(uint)(fVar20 < 1.0) & (uint)(fVar20 + -1.0) |
                 (uint)(1.0 - fVar20) & -(uint)(fVar20 < 1.0)) < 2e-06) break;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar14;
      uVar10 = (ulong)*(uint *)(puVar12 +
                               (SUB168(auVar8 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 &
                               0xfffffffffffffffcU) * -3);
      p_Var5 = (this->super_xr_mesh_builder).super_xr_mesh.m_points.
               super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      fVar22 = p_Var5[uVar10].field_0.field_0.x - fVar2;
      fVar24 = p_Var5[uVar10].field_0.field_0.y - fVar3;
      fVar23 = p_Var5[uVar10].field_0.field_0.z - fVar4;
      fVar20 = (fVar23 * fVar23 + fVar22 * fVar22 + fVar24 * fVar24) * fVar19;
      if (fVar20 < 0.0) {
        local_58 = ZEXT416((uint)fVar23);
        fVar20 = sqrtf(fVar20);
        fVar23 = local_58._0_4_;
      }
      else {
        fVar20 = SQRT(fVar20);
      }
      fVar20 = (fVar23 * fVar18 + fVar22 * fVar17 + fVar24 * fVar21) / fVar20;
      if ((float)(~-(uint)(fVar20 < 1.0) & (uint)(fVar20 + -1.0) |
                 (uint)(1.0 - fVar20) & -(uint)(fVar20 < 1.0)) < 2e-06) break;
      uVar13 = *(uint *)((long)pbVar6 + lVar15 * 4 + uVar9 * 0x40);
      if (uVar13 == 0xffffffff) {
        return false;
      }
    }
    if (uVar10 == uVar16) {
      return false;
    }
    uVar13 = (uint)uVar10;
    __position._M_current =
         (this->m_path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_5c = uVar13;
    if (__position._M_current ==
        (this->m_path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (local_48,__position,&local_5c);
    }
    else {
      *__position._M_current = uVar13;
      (this->m_path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    uVar16 = uVar10;
    if (uVar13 == (uint)local_40) {
      return true;
    }
  } while( true );
}

Assistant:

bool level_mesh::search_colinear_path(uint32_t v0, uint32_t v1)
{
	fvector3 px, span;
	span.sub(m_points[v0], m_points[v1]);

	m_path.assign(1, v1);
	for (uint_fast32_t vx = v1, vm;; vx = vm) {
		px.set(m_points[vm = vx]);
		for (uint_fast32_t next = m_vertex_faces[vx]; next != BAD_IDX;) {
			const b_face& face = m_faces[next];
			uint_fast32_t ix = face.local_vert_idx(vx), vt;
			if (equivalent(span.cosine(fvector3().sub(m_points[vt = face.v[(ix + 1)%3]], px)), 1.f, 2e-6f)) {
				vm = vt;
				break;
			}
			if (equivalent(span.cosine(fvector3().sub(m_points[vt = face.v[(ix + 2)%3]], px)), 1.f, 2e-6f)) {
				vm = vt;
				break;
			}
			next = face.link[ix];
		}
		if (vm == vx)
			return false;
		m_path.push_back(uint32_t(vm & UINT32_MAX));
		if (vm == v0)
			return true;
	}
	return false;
}